

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

cl_int __thiscall
CLIntercept::WriteBuffer
          (CLIntercept *this,cl_command_queue commandQueue,cl_mem dstBuffer,cl_bool blockingWrite,
          size_t dstOffset,size_t bytesToWrite,void *srcPtr,cl_uint numEventsInWaitList,
          cl_event *eventWaitList,cl_event *event)

{
  int iVar1;
  cl_mem srcBuffer;
  ulong srcOffset;
  int local_50;
  cl_bool local_4c;
  cl_context context;
  size_t local_40;
  cl_mem local_38;
  
  local_38 = dstBuffer;
  std::mutex::lock(&this->m_Mutex);
  context = (cl_context)0x0;
  local_50 = (*(this->m_Dispatch).clGetCommandQueueInfo)
                       (commandQueue,0x1090,8,&context,(size_t *)0x0);
  if (local_50 == 0) {
    srcOffset = (ulong)((uint)srcPtr & 0xfff);
    local_4c = blockingWrite;
    local_40 = dstOffset;
    srcBuffer = (*(this->m_Dispatch).clCreateBuffer)
                          (context,0xc,srcOffset + bytesToWrite,(void *)((long)srcPtr - srcOffset),
                           &local_50);
    if (local_50 == 0) {
      local_50 = CopyBufferHelper(this,context,commandQueue,srcBuffer,local_38,srcOffset,local_40,
                                  bytesToWrite,numEventsInWaitList,eventWaitList,event);
      if ((local_4c != 0) && (local_50 == 0)) {
        local_50 = (*(this->m_Dispatch).clFinish)(commandQueue);
      }
    }
  }
  else {
    srcBuffer = (cl_mem)0x0;
  }
  (*(this->m_Dispatch).clReleaseMemObject)(srcBuffer);
  iVar1 = local_50;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return iVar1;
}

Assistant:

cl_int CLIntercept::WriteBuffer(
    cl_command_queue commandQueue,
    cl_mem dstBuffer,
    cl_bool blockingWrite,
    size_t dstOffset,
    size_t bytesToWrite,
    const void* srcPtr,
    cl_uint numEventsInWaitList,
    const cl_event* eventWaitList,
    cl_event* event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    cl_context  context = NULL;

    // Get the context for this command queue.
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetCommandQueueInfo(
            commandQueue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );
    }

    size_t  srcOffset = 0;

    // Align the passed-in pointer to a page boundary.
    if( errorCode == CL_SUCCESS )
    {
        const size_t    alignSize = 4096;

        unsigned char*  bptr = (unsigned char*)srcPtr;
        uintptr_t   uiptr = (uintptr_t)bptr;

        srcOffset = uiptr % alignSize;
        bptr -= srcOffset;

        srcPtr = bptr;
    }

    cl_mem  srcBuffer = NULL;

    // Create a USE_HOST_PTR buffer for the passed-in pointer.
    // The size of the buffer will be at least srcOffset + bytesToWrite.
    if( errorCode == CL_SUCCESS )
    {
        size_t  srcBufferSize = srcOffset + bytesToWrite;

        srcBuffer = dispatch().clCreateBuffer(
            context,
            CL_MEM_USE_HOST_PTR | CL_MEM_READ_ONLY,
            srcBufferSize,
            (void*)srcPtr,
            &errorCode );
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = CopyBufferHelper(
            context,
            commandQueue,
            srcBuffer,
            dstBuffer,
            srcOffset,
            dstOffset,
            bytesToWrite,
            numEventsInWaitList,
            eventWaitList,
            event );
    }

    if( errorCode == CL_SUCCESS )
    {
        if( blockingWrite )
        {
            errorCode = dispatch().clFinish(
                commandQueue );
        }
    }

    dispatch().clReleaseMemObject( srcBuffer );

    return errorCode;
}